

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

void Abc_NtkShareFindBestMatch(Vec_Ptr_t *vBuckets,Vec_Int_t **pvInput,Vec_Int_t **pvInput2)

{
  int iVar1;
  int b;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *p;
  void *Entry;
  Vec_Int_t *vArr1;
  Vec_Int_t *vArr2;
  int local_70;
  int DelayBest;
  int Delay;
  int CostBest;
  int Cost;
  int k;
  int i;
  Vec_Int_t *vInputBest2;
  Vec_Int_t *vInputBest;
  Vec_Int_t *vInput2;
  Vec_Int_t *vInput;
  Vec_Ptr_t *vBucket;
  Vec_Ptr_t *vPool;
  int nPoolSize;
  Vec_Int_t **pvInput2_local;
  Vec_Int_t **pvInput_local;
  Vec_Ptr_t *vBuckets_local;
  
  pVVar3 = Vec_PtrAlloc(0x28);
  vInputBest2 = (Vec_Int_t *)0x0;
  _k = (Vec_Int_t *)0x0;
  DelayBest = 0;
  local_70 = 0;
  Cost = Vec_PtrSize(vBuckets);
  while (Cost = Cost + -1, -1 < Cost) {
    p = (Vec_Ptr_t *)Vec_PtrEntry(vBuckets,Cost);
    for (CostBest = 0; iVar2 = Vec_PtrSize(p), CostBest < iVar2; CostBest = CostBest + 1) {
      Entry = Vec_PtrEntry(p,CostBest);
      Vec_PtrPush(pVVar3,Entry);
      iVar2 = Vec_PtrSize(pVVar3);
      if (iVar2 == 0x28) goto LAB_002b103e;
    }
  }
LAB_002b103e:
  Cost = Vec_PtrSize(pVVar3);
  while (Cost = Cost + -1, -1 < Cost) {
    vArr1 = (Vec_Int_t *)Vec_PtrEntry(pVVar3,Cost);
    CostBest = Vec_PtrSize(pVVar3);
    while (CostBest = CostBest + -1, -1 < CostBest) {
      vArr2 = (Vec_Int_t *)Vec_PtrEntry(pVVar3,CostBest);
      if (Cost != CostBest) {
        vArr1->pArray = vArr1->pArray + 2;
        vArr2->pArray = vArr2->pArray + 2;
        vArr1->nSize = vArr1->nSize + -2;
        vArr2->nSize = vArr2->nSize + -2;
        iVar2 = Vec_IntTwoCountCommon(vArr1,vArr2);
        vArr1->pArray = vArr1->pArray + -2;
        vArr2->pArray = vArr2->pArray + -2;
        vArr1->nSize = vArr1->nSize + 2;
        vArr2->nSize = vArr2->nSize + 2;
        if (1 < iVar2) {
          iVar1 = Vec_IntEntry(vArr1,1);
          b = Vec_IntEntry(vArr2,1);
          iVar1 = Abc_MaxInt(iVar1,b);
          if ((DelayBest < iVar2) || ((DelayBest == iVar2 && (iVar1 < local_70)))) {
            local_70 = iVar1;
            DelayBest = iVar2;
            _k = vArr2;
            vInputBest2 = vArr1;
          }
        }
      }
    }
  }
  Vec_PtrFree(pVVar3);
  *pvInput = vInputBest2;
  *pvInput2 = _k;
  if (vInputBest2 != (Vec_Int_t *)0x0) {
    iVar2 = Vec_IntSize(vInputBest2);
    pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vBuckets,iVar2 + -2);
    Vec_PtrRemove(pVVar3,vInputBest2);
    iVar2 = Vec_IntSize(_k);
    pVVar3 = (Vec_Ptr_t *)Vec_PtrEntry(vBuckets,iVar2 + -2);
    Vec_PtrRemove(pVVar3,_k);
  }
  return;
}

Assistant:

void Abc_NtkShareFindBestMatch( Vec_Ptr_t * vBuckets, Vec_Int_t ** pvInput, Vec_Int_t ** pvInput2 )
{
    int nPoolSize = 40;
    Vec_Ptr_t * vPool = Vec_PtrAlloc( nPoolSize );
    Vec_Ptr_t * vBucket;
    Vec_Int_t * vInput, * vInput2, * vInputBest = NULL, * vInputBest2 = NULL;
    int i, k, Cost, CostBest = 0, Delay, DelayBest = 0;

    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vBuckets, vBucket, i )
        Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, k )
        {
            Vec_PtrPush( vPool, vInput );
            if ( Vec_PtrSize(vPool) == nPoolSize )
                goto outside;
        }
outside:

    Vec_PtrForEachEntryReverse( Vec_Int_t *, vPool, vInput, i )
    Vec_PtrForEachEntryReverse( Vec_Int_t *, vPool, vInput2, k )
    {
        if ( i == k )
            continue;

        vInput->pArray += SHARE_NUM;
        vInput2->pArray += SHARE_NUM;
        vInput->nSize -= SHARE_NUM;
        vInput2->nSize -= SHARE_NUM;

        Cost = Vec_IntTwoCountCommon(vInput, vInput2);

        vInput->pArray -= SHARE_NUM;
        vInput2->pArray -= SHARE_NUM;
        vInput->nSize += SHARE_NUM;
        vInput2->nSize += SHARE_NUM;

        if ( Cost < 2 )
            continue;

        Delay = Abc_MaxInt( Vec_IntEntry(vInput, 1), Vec_IntEntry(vInput2, 1) );

        if ( CostBest < Cost || (CostBest == Cost && (DelayBest > Delay)) )
        {
            CostBest = Cost;
            DelayBest = Delay;
            vInputBest = vInput;
            vInputBest2 = vInput2;
        }
    }
    Vec_PtrFree( vPool );

    *pvInput  = vInputBest;
    *pvInput2 = vInputBest2;

    if ( vInputBest == NULL )
        return;

    Vec_PtrRemove( (Vec_Ptr_t *)Vec_PtrEntry(vBuckets, Vec_IntSize(vInputBest)-SHARE_NUM),  (Vec_Int_t *)vInputBest ); 
    Vec_PtrRemove( (Vec_Ptr_t *)Vec_PtrEntry(vBuckets, Vec_IntSize(vInputBest2)-SHARE_NUM), (Vec_Int_t *)vInputBest2 ); 
}